

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O0

sxi32 jx9CompileJsonObject(jx9_gen_state *pGen,sxi32 iCompileFlag)

{
  SyToken *pIn;
  sxi32 sVar1;
  bool bVar2;
  int local_34;
  sxi32 rc;
  sxi32 nPair;
  SyToken *pCur;
  SyToken *pKey;
  sxi32 iCompileFlag_local;
  jx9_gen_state *pGen_local;
  
  local_34 = 0;
  pGen->pIn = pGen->pIn + 1;
  pGen->pEnd = pGen->pEnd + -1;
  do {
    while( true ) {
      bVar2 = false;
      if (pGen->pIn < pGen->pEnd) {
        bVar2 = (pGen->pIn->nType & 0x20000) != 0;
      }
      if (!bVar2) break;
      pGen->pIn = pGen->pIn + 1;
    }
    pIn = pGen->pIn;
    sVar1 = jx9GetNextExpr(pGen->pIn,pGen->pEnd,&pGen->pIn);
    _rc = pIn;
    if (sVar1 != 0) {
      jx9VmEmitInstr(pGen->pVm,6,local_34 << 1,1,(void *)0x0,(sxu32 *)0x0);
      return 0;
    }
    for (; (_rc < pGen->pIn && ((_rc->nType & 0x100000) == 0)); _rc = _rc + 1) {
    }
    if ((_rc->nType & 0x100000) == 0) {
      sVar1 = jx9GenCompileError(pGen,-1,_rc->nLine,"JSON Object: Missing colon string \":\"");
      if (sVar1 == -10) {
        return -10;
      }
      return 0;
    }
    if (_rc < pGen->pIn) {
      if (pGen->pIn <= _rc + 1) {
        sVar1 = jx9GenCompileError(pGen,1,_rc->nLine,"JSON Object: Missing entry value");
        if (sVar1 == -10) {
          return -10;
        }
        return 0;
      }
      sVar1 = GenStateCompileJSONEntry(pGen,pIn,_rc,2,GenStateJSONObjectKeyNodeValidator);
      if (sVar1 == -10) {
        return -10;
      }
      pIn = _rc + 1;
    }
    else if (pIn == _rc) {
      jx9GenCompileError(pGen,1,_rc->nLine,"JSON Object: Missing entry key");
      pIn = _rc + 1;
    }
    _rc = pIn;
    sVar1 = GenStateCompileJSONEntry
                      (pGen,_rc,pGen->pIn,2,(_func_sxi32_jx9_gen_state_ptr_jx9_expr_node_ptr *)0x0);
    if (sVar1 == -10) {
      return -10;
    }
    local_34 = local_34 + 1;
  } while( true );
}

Assistant:

JX9_PRIVATE sxi32 jx9CompileJsonObject(jx9_gen_state *pGen, sxi32 iCompileFlag)
{
	SyToken *pKey, *pCur;
	sxi32 nPair = 0;
	sxi32 rc;

	pGen->pIn++; /* Jump the open querly braces '{'*/
	pGen->pEnd--;
	SXUNUSED(iCompileFlag); /* cc warning */
	for(;;){
		/* Jump leading commas */
		while( pGen->pIn < pGen->pEnd && (pGen->pIn->nType & JX9_TK_COMMA) ){
			pGen->pIn++;
		}
		pCur = pGen->pIn;
		if( SXRET_OK != jx9GetNextExpr(pGen->pIn, pGen->pEnd, &pGen->pIn) ){
			/* No more entry to process */
			break;
		}
		/* Compile the key */
		pKey = pCur;
		while( pCur < pGen->pIn ){
			if( pCur->nType & JX9_TK_COLON /*':'*/  ){
				break;
			}
			pCur++;
		}
		rc = SXERR_EMPTY;
		if( (pCur->nType & JX9_TK_COLON) == 0 ){
			rc = jx9GenCompileError(&(*pGen), E_ABORT, pCur->nLine, "JSON Object: Missing colon string \":\"");
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			return SXRET_OK;
		}

		if( pCur < pGen->pIn ){
			if( &pCur[1] >= pGen->pIn ){
				/* Missing value */
				rc = jx9GenCompileError(&(*pGen), E_ERROR, pCur->nLine, "JSON Object: Missing entry value");
				if( rc == SXERR_ABORT ){
					return SXERR_ABORT;
				}
				return SXRET_OK;
			}
			/* Compile the expression holding the key */
			rc = GenStateCompileJSONEntry(&(*pGen), pKey, pCur,
				EXPR_FLAG_RDONLY_LOAD                /* Do not create the variable if inexistant */, 
				GenStateJSONObjectKeyNodeValidator   /* Node validator callback */
				);
			if( rc == SXERR_ABORT ){
				return SXERR_ABORT;
			}
			pCur++; /* Jump the double colon ':'  */
		}else if( pKey == pCur ){
			/* Key is omitted, emit an error */
			jx9GenCompileError(&(*pGen),E_ERROR, pCur->nLine, "JSON Object: Missing entry key");
			pCur++; /* Jump the double colon ':'  */
		}else{
			/* Reset back the cursor and point to the entry value */
			pCur = pKey;
		}
		/* Compile indice value */
		rc = GenStateCompileJSONEntry(&(*pGen), pCur, pGen->pIn, EXPR_FLAG_RDONLY_LOAD/*Do not create the variable if inexistant*/,0);
		if( rc == SXERR_ABORT ){
			return SXERR_ABORT;
		}
		nPair++;
	}
	/* Emit the load map instruction */
	jx9VmEmitInstr(pGen->pVm, JX9_OP_LOAD_MAP, nPair * 2, 1, 0, 0);
	/* Node successfully compiled */
	return SXRET_OK;
}